

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::DefineOwnPropertyForTypedArray
               (TypedArrayBase *typedArray,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext)

{
  bool bVar1;
  uint32 uVar2;
  BOOL BVar3;
  int iVar4;
  PropertyRecord *pPVar5;
  PropertyString *aValue;
  double local_40;
  double result;
  
  pPVar5 = ScriptContext::GetPropertyName(scriptContext,propId);
  if (pPVar5->isNumeric == true) {
    uVar2 = PropertyRecord::GetNumericValue(pPVar5);
    if (uVar2 < (typedArray->super_ArrayBufferParent).super_ArrayObject.length) {
      if ((((descriptor->setterSpecified == false && descriptor->getterSpecified == false) &&
           ((result._4_4_ = uVar2, descriptor->configurableSpecified != true ||
            (bVar1 = PropertyDescriptor::IsConfigurable(descriptor), !bVar1)))) &&
          ((descriptor->enumerableSpecified != true ||
           (bVar1 = PropertyDescriptor::IsEnumerable(descriptor), bVar1)))) &&
         ((descriptor->writableSpecified != true ||
          (bVar1 = PropertyDescriptor::IsWritable(descriptor), bVar1)))) {
        if (descriptor->valueSpecified == true) {
          iVar4 = (*(typedArray->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x70])
                            (typedArray,(ulong)result._4_4_,(descriptor->Value).ptr);
          return iVar4;
        }
        return 1;
      }
      if (!throwOnError) {
        return 0;
      }
      pPVar5 = ThreadContext::GetPropertyName(scriptContext->threadContext,propId);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2a,(PCWSTR)(pPVar5 + 1));
    }
LAB_00aca1c0:
    if (!throwOnError) {
      return 0;
    }
    pPVar5 = ThreadContext::GetPropertyName(scriptContext->threadContext,propId);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9e1,(PCWSTR)(pPVar5 + 1));
  }
  if (pPVar5->isSymbol == false) {
    aValue = ScriptContext::GetPropertyString(scriptContext,propId);
    BVar3 = JavascriptConversion::CanonicalNumericIndexString
                      (&aValue->super_JavascriptString,&local_40,scriptContext);
    if (BVar3 != 0) goto LAB_00aca1c0;
  }
  BVar3 = DefineOwnPropertyDescriptor
                    ((RecyclableObject *)typedArray,propId,descriptor,throwOnError,scriptContext,
                     PropertyOperation_None);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyForTypedArray(TypedArrayBase* typedArray, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext)
    {
        // 1. Assert: IsPropertyKey(P) is true.
        // 2. Assert: Assert: O is an Object that has a [[ViewedArrayBuffer]] internal slot.

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propId);
        // 3. If Type(P) is String, then
        // a. Let numericIndex be ! CanonicalNumericIndexString(P).
        // b. If numericIndex is not undefined, then
        // i. if IsInteger(numbericIndex), return false
        // ii. if numbericIndex = -0, return false
        // iii. If numericIndex < 0, return false.

        if (propertyRecord->IsNumeric()) {
            uint32 uint32Index = propertyRecord->GetNumericValue();
            // iv. Let length be O.[[ArrayLength]].
            uint32 length = typedArray->GetLength();
            // v. If numericIndex >= length, return false.
            if (uint32Index >= length)
            {
                return Reject(throwOnError, scriptContext, JSERR_InvalidTypedArrayIndex, propId);
            }
            // vi. If IsAccessorDescriptor(Desc) is true, return false.
            // vii. If Desc has a[[Configurable]] field and if Desc.[[Configurable]] is true, return false.
            // viii. If Desc has an[[Enumerable]] field and if Desc.[[Enumerable]] is false, return false.
            // ix. If Desc has a[[Writable]] field and if Desc.[[Writable]] is false, return false.
            if (descriptor.IsAccessorDescriptor()
                || (descriptor.ConfigurableSpecified() && descriptor.IsConfigurable())
                || (descriptor.EnumerableSpecified() && !descriptor.IsEnumerable())
                || (descriptor.WritableSpecified() && !descriptor.IsWritable()))
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_NotConfigurable, propId);
            }            // x. If Desc has a[[Value]] field, then
            // 1. Let value be Desc.[[Value]].
            // 2. Return ? IntegerIndexedElementSet(O, numericIndex, value).
            if (descriptor.ValueSpecified())
            {
                Js::Var value = descriptor.GetValue();
                return typedArray->DirectSetItem(uint32Index, value);
            }
            // xi. Return true.
            return true;
        }
        if (!propertyRecord->IsSymbol())
        {
            PropertyString *propertyString = scriptContext->GetPropertyString(propId);
            double result;
            if (JavascriptConversion::CanonicalNumericIndexString(propertyString, &result, scriptContext))
            {
                return Reject(throwOnError, scriptContext, JSERR_InvalidTypedArrayIndex, propId);
            }
        }
        // 4. Return ! OrdinaryDefineOwnProperty(O, P, Desc).
        return DefineOwnPropertyDescriptor(typedArray, propId, descriptor, throwOnError, scriptContext);
    }